

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitester.cpp
# Opt level: O2

void no_nul_test(void)

{
  long lVar1;
  ssize_t sVar2;
  size_t in_RCX;
  long in_FS_OFFSET;
  UniValue val;
  char buf [14];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(buf + 8,"3]___",6);
  builtin_strncpy(buf,"___[1,2,",8);
  val.val._M_dataplus._M_p = (pointer)&val.val.field_2;
  val.val._M_string_length = 0;
  val.val.field_2._M_local_buf[0] = '\0';
  val.typ = VNULL;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  sVar2 = UniValue::read(&val,7,buf + 3,in_RCX);
  if ((char)sVar2 == '\0') {
    __assert_fail("val.read({buf + 3, 7})",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x9c,"void no_nul_test()");
  }
  UniValue::~UniValue(&val);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void no_nul_test()
{
    char buf[] = "___[1,2,3]___";
    UniValue val;
    assert(val.read({buf + 3, 7}));
}